

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O1

void __thiscall spirv_cross::DominatorBuilder::lift_continue_block_dominator(DominatorBuilder *this)

{
  int iVar1;
  size_t sVar2;
  Case *pCVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  SPIRBlock *block;
  SmallVector<spirv_cross::SPIRBlock::Case,_8UL> *pSVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  
  if ((ulong)this->dominator != 0) {
    block = Variant::get<spirv_cross::SPIRBlock>
                      ((this->cfg->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                       this->dominator);
    uVar4 = CFG::get_visit_order(this->cfg,this->dominator);
    iVar1 = *(int *)&(block->super_IVariant).field_0xc;
    if (iVar1 == 3) {
      pSVar7 = Compiler::get_case_list(this->cfg->compiler,block);
      sVar2 = (pSVar7->super_VectorView<spirv_cross::SPIRBlock::Case>).buffer_size;
      if (sVar2 == 0) {
        bVar9 = false;
      }
      else {
        pCVar3 = (pSVar7->super_VectorView<spirv_cross::SPIRBlock::Case>).ptr;
        lVar8 = 0;
        bVar9 = false;
        do {
          uVar5 = CFG::get_visit_order(this->cfg,*(uint32_t *)((long)&(pCVar3->block).id + lVar8));
          if (uVar4 < uVar5) {
            bVar9 = true;
          }
          lVar8 = lVar8 + 0x10;
        } while (sVar2 << 4 != lVar8);
      }
      uVar5 = (block->default_block).id;
      bVar10 = bVar9;
      if (uVar5 != 0) {
        uVar5 = CFG::get_visit_order(this->cfg,uVar5);
        bVar10 = true;
        if (uVar5 <= uVar4) {
          bVar10 = bVar9;
        }
      }
    }
    else if (iVar1 == 2) {
      uVar5 = CFG::get_visit_order(this->cfg,(block->true_block).id);
      uVar6 = CFG::get_visit_order(this->cfg,(block->false_block).id);
      bVar10 = uVar4 < uVar6 || uVar4 < uVar5;
    }
    else if (iVar1 == 1) {
      uVar5 = CFG::get_visit_order(this->cfg,(block->next_block).id);
      bVar10 = uVar4 < uVar5;
    }
    else {
      bVar10 = false;
    }
    if (bVar10) {
      this->dominator = (this->cfg->func->entry_block).id;
    }
  }
  return;
}

Assistant:

void DominatorBuilder::lift_continue_block_dominator()
{
	// It is possible for a continue block to be the dominator of a variable is only accessed inside the while block of a do-while loop.
	// We cannot safely declare variables inside a continue block, so move any variable declared
	// in a continue block to the entry block to simplify.
	// It makes very little sense for a continue block to ever be a dominator, so fall back to the simplest
	// solution.

	if (!dominator)
		return;

	auto &block = cfg.get_compiler().get<SPIRBlock>(dominator);
	auto post_order = cfg.get_visit_order(dominator);

	// If we are branching to a block with a higher post-order traversal index (continue blocks), we have a problem
	// since we cannot create sensible GLSL code for this, fallback to entry block.
	bool back_edge_dominator = false;
	switch (block.terminator)
	{
	case SPIRBlock::Direct:
		if (cfg.get_visit_order(block.next_block) > post_order)
			back_edge_dominator = true;
		break;

	case SPIRBlock::Select:
		if (cfg.get_visit_order(block.true_block) > post_order)
			back_edge_dominator = true;
		if (cfg.get_visit_order(block.false_block) > post_order)
			back_edge_dominator = true;
		break;

	case SPIRBlock::MultiSelect:
	{
		auto &cases = cfg.get_compiler().get_case_list(block);
		for (auto &target : cases)
		{
			if (cfg.get_visit_order(target.block) > post_order)
				back_edge_dominator = true;
		}
		if (block.default_block && cfg.get_visit_order(block.default_block) > post_order)
			back_edge_dominator = true;
		break;
	}

	default:
		break;
	}

	if (back_edge_dominator)
		dominator = cfg.get_function().entry_block;
}